

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O1

uchar * cd_alloc(zip_conflict *zip,size_t length)

{
  cd_segment **ppcVar1;
  cd_segment *pcVar2;
  uchar *puVar3;
  cd_segment *pcVar4;
  cd_segment **ppcVar5;
  
  pcVar4 = zip->central_directory;
  if ((pcVar4 == (cd_segment *)0x0) ||
     (pcVar2 = zip->central_directory_last, pcVar2->buff + pcVar2->buff_size < pcVar2->p + length))
  {
    pcVar2 = (cd_segment *)calloc(1,0x20);
    if (pcVar2 != (cd_segment *)0x0) {
      pcVar2->buff_size = 0x10000;
      puVar3 = (uchar *)malloc(0x10000);
      pcVar2->buff = puVar3;
      if (puVar3 != (uchar *)0x0) {
        ppcVar1 = &zip->central_directory_last;
        pcVar2->p = puVar3;
        if (pcVar4 == (cd_segment *)0x0) {
          ppcVar5 = &zip->central_directory;
          pcVar4 = (cd_segment *)ppcVar1;
        }
        else {
          pcVar4 = *ppcVar1;
          ppcVar5 = ppcVar1;
        }
        pcVar4->next = pcVar2;
        *ppcVar5 = pcVar2;
        goto LAB_0048f129;
      }
      free(pcVar2);
    }
    puVar3 = (uchar *)0x0;
  }
  else {
LAB_0048f129:
    puVar3 = zip->central_directory_last->p;
    zip->central_directory_last->p = puVar3 + length;
    zip->central_directory_bytes = zip->central_directory_bytes + length;
  }
  return puVar3;
}

Assistant:

static unsigned char *
cd_alloc(struct zip *zip, size_t length)
{
	unsigned char *p;

	if (zip->central_directory == NULL
	    || (zip->central_directory_last->p + length
		> zip->central_directory_last->buff + zip->central_directory_last->buff_size)) {
		struct cd_segment *segment = calloc(1, sizeof(*segment));
		if (segment == NULL)
			return NULL;
		segment->buff_size = 64 * 1024;
		segment->buff = malloc(segment->buff_size);
		if (segment->buff == NULL) {
			free(segment);
			return NULL;
		}
		segment->p = segment->buff;

		if (zip->central_directory == NULL) {
			zip->central_directory
			    = zip->central_directory_last
			    = segment;
		} else {
			zip->central_directory_last->next = segment;
			zip->central_directory_last = segment;
		}
	}

	p = zip->central_directory_last->p;
	zip->central_directory_last->p += length;
	zip->central_directory_bytes += length;
	return (p);
}